

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDiag.cpp
# Opt level: O1

JsErrorCode
JsDiagSetBreakpoint(uint scriptId,uint lineNumber,uint columnNumber,JsValueRef *breakpoint)

{
  JsrtRuntime *this;
  RecyclerWeakReference<Js::Utf8SourceInfo> *pRVar1;
  Utf8SourceInfo *pUVar2;
  code *pcVar3;
  bool bVar4;
  JsErrorCode JVar5;
  int iVar6;
  JsrtContext *pJVar7;
  JsrtDebugManager *pJVar8;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
  *pLVar9;
  DynamicObject *pDVar10;
  undefined4 *puVar11;
  long lVar12;
  long lVar13;
  Utf8SourceInfo *utf8SourceInfo;
  ScriptContext *pSVar14;
  void *unaff_retaddr;
  undefined1 auStack_d8 [8];
  TTDebuggerAbortException anon_var_0;
  undefined1 local_98 [8];
  EnterScriptObject __enterScriptObject;
  AutoNestedHandledExceptionType local_34 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  pJVar7 = JsrtContext::GetCurrent();
  JVar5 = CheckContext(pJVar7,false,false);
  if (JVar5 == JsNoError) {
    pSVar14 = (((pJVar7->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (local_34,ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
    anon_var_0.m_staticAbortMessage = (char16 *)0x0;
    anon_var_0.m_optEventTime = 0;
    anon_var_0.m_optMoveMode = 0;
    auStack_d8 = (undefined1  [8])0x0;
    anon_var_0.m_abortCode = 0;
    anon_var_0._4_4_ = 0;
    Js::EnterScriptObject::EnterScriptObject
              ((EnterScriptObject *)local_98,pSVar14,(ScriptEntryExitRecord *)auStack_d8,
               unaff_retaddr,&stack0x00000000,true,true,true);
    Js::ScriptContext::OnScriptStart(pSVar14,true,true);
    Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_98);
    if (breakpoint == (JsValueRef *)0x0) {
      JVar5 = JsErrorNullArgument;
    }
    else {
      *breakpoint = (JsValueRef)0x0;
      pJVar7 = JsrtContext::GetCurrent();
      this = (pJVar7->runtime).ptr;
      ThreadContextScope::ThreadContextScope
                ((ThreadContextScope *)&__enterScriptObject.library,this->threadContext);
      JVar5 = JsErrorWrongThread;
      if (__enterScriptObject.library._1_1_ == '\x01') {
        pJVar8 = JsrtRuntime::GetJsrtDebugManager(this);
        JVar5 = JsErrorDiagNotInDebugMode;
        if (pJVar8 != (JsrtDebugManager *)0x0) {
          pJVar8 = JsrtRuntime::GetJsrtDebugManager(this);
          bVar4 = JsrtDebugManager::IsDebugEventCallbackSet(pJVar8);
          if (bVar4) {
            pSVar14 = this->threadContext->scriptContextList;
            bVar4 = true;
            utf8SourceInfo = (Utf8SourceInfo *)0x0;
            if (pSVar14 != (ScriptContext *)0x0) {
              while( true ) {
                iVar6 = (*(pSVar14->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])(pSVar14)
                ;
                if ((char)iVar6 != '\0') break;
                pLVar9 = Memory::
                         RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
                         ::operator->(&pSVar14->sourceList);
                lVar12 = (long)(pLVar9->
                               super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                               ).count;
                if (0 < lVar12) {
                  lVar13 = 0;
                  do {
                    pRVar1 = (pLVar9->
                             super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                             ).buffer.ptr[lVar13].ptr;
                    if (((((ulong)pRVar1 & 1) == 0 &&
                          pRVar1 != (RecyclerWeakReference<Js::Utf8SourceInfo> *)0x0) &&
                        (pUVar2 = (Utf8SourceInfo *)
                                  (pRVar1->super_RecyclerWeakReferenceBase).strongRef,
                        pUVar2 != (Utf8SourceInfo *)0x0)) && (pUVar2->m_sourceInfoId == scriptId)) {
                      utf8SourceInfo = pUVar2;
                    }
                    lVar13 = lVar13 + 1;
                  } while (lVar12 != lVar13);
                }
                pSVar14 = pSVar14->next;
                bVar4 = utf8SourceInfo == (Utf8SourceInfo *)0x0;
                if ((pSVar14 == (ScriptContext *)0x0) || (utf8SourceInfo != (Utf8SourceInfo *)0x0))
                break;
              }
            }
            JVar5 = JsErrorDiagObjectNotFound;
            if ((!bVar4) && ((utf8SourceInfo->m_debugDocument).ptr != (DebugDocument *)0x0)) {
              pJVar8 = JsrtRuntime::GetJsrtDebugManager(this);
              pDVar10 = JsrtDebugManager::SetBreakPoint
                                  (pJVar8,(((pJVar7->javascriptLibrary).ptr)->
                                          super_JavascriptLibraryBase).scriptContext.ptr,
                                   utf8SourceInfo,lineNumber,columnNumber);
              if (pDVar10 == (DynamicObject *)0x0) {
                JVar5 = JsErrorDiagUnableToPerformAction;
              }
              else {
                *breakpoint = pDVar10;
                JVar5 = JsNoError;
              }
            }
          }
        }
      }
      ThreadContextScope::~ThreadContextScope((ThreadContextScope *)&__enterScriptObject.library);
    }
    Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_98);
    if (((((JVar5 & 0x6ffff) == JsErrorOutOfMemory) ||
         ((JVar5 - JsErrorNoCurrentContext < 7 &&
          ((0x43U >> (JVar5 - JsErrorNoCurrentContext & 0x1f) & 1) != 0)))) ||
        (JVar5 == JsErrorFatal)) || (JVar5 == JsErrorScriptTerminated)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtInternal.h"
                         ,0xcc,
                         "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated)"
                         ,
                         "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated"
                        );
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar11 = 0;
    }
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_34);
  }
  return JVar5;
}

Assistant:

CHAKRA_API JsDiagSetBreakpoint(
    _In_ unsigned int scriptId,
    _In_ unsigned int lineNumber,
    _In_ unsigned int columnNumber,
    _Out_ JsValueRef *breakpoint)
{
#ifndef ENABLE_SCRIPT_DEBUGGING
    return JsErrorCategoryUsage;
#else
    return ContextAPIWrapper_NoRecord<false>([&](Js::ScriptContext* scriptContext) -> JsErrorCode {
        PARAM_NOT_NULL(breakpoint);
        *breakpoint = JS_INVALID_REFERENCE;

        JsrtContext* currentContext = JsrtContext::GetCurrent();
        JsrtRuntime* runtime = currentContext->GetRuntime();

        ThreadContextScope scope(runtime->GetThreadContext());

        if (!scope.IsValid())
        {
            return JsErrorWrongThread;
        }

        VALIDATE_IS_DEBUGGING(runtime->GetJsrtDebugManager());

        Js::Utf8SourceInfo* utf8SourceInfo = nullptr;

        for (Js::ScriptContext* currentScriptContext = runtime->GetThreadContext()->GetScriptContextList();
            currentScriptContext != nullptr && utf8SourceInfo == nullptr && !currentScriptContext->IsClosed();
            currentScriptContext = currentScriptContext->next)
        {
            currentScriptContext->MapScript([&](Js::Utf8SourceInfo* sourceInfo) -> bool
            {
                if (sourceInfo->GetSourceInfoId() == scriptId)
                {
                    utf8SourceInfo = sourceInfo;
                    return true;
                }
                return false;
            });
        }

        if (utf8SourceInfo != nullptr && utf8SourceInfo->HasDebugDocument())
        {
            JsrtDebugManager* jsrtDebugManager = runtime->GetJsrtDebugManager();
            Js::DynamicObject* bpObject = jsrtDebugManager->SetBreakPoint(currentContext->GetScriptContext(), utf8SourceInfo, lineNumber, columnNumber);

            if(bpObject != nullptr)
            {
                *breakpoint = bpObject;
                return JsNoError;
            }

            return JsErrorDiagUnableToPerformAction;
        }

        return JsErrorDiagObjectNotFound;
    });
#endif
}